

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

bool __thiscall
QScrollerPrivate::moveWhilePressed(QScrollerPrivate *this,QPointF *position,qint64 timestamp)

{
  QScrollerPropertiesPrivate *pQVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  QPointF QVar12;
  QPointF local_58;
  QPointF local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->properties).d.d;
  QVar12 = QScroller::pixelPerMeter(this->q_ptr);
  dVar10 = position->xp - (this->pressPosition).xp;
  dVar11 = position->yp - (this->pressPosition).yp;
  auVar7._8_8_ = dVar11;
  auVar7._0_8_ = dVar10;
  auVar7 = divpd(auVar7,(undefined1  [16])QVar12);
  dVar6 = auVar7._0_8_;
  dVar8 = auVar7._8_8_;
  uVar4 = -(ulong)(dVar6 < -dVar6);
  uVar5 = -(ulong)(dVar8 < -dVar8);
  dVar6 = (double)(~uVar4 & (ulong)dVar6 | (ulong)-dVar6 & uVar4);
  dVar8 = (double)(~uVar5 & (ulong)dVar8 | (ulong)-dVar8 & uVar5);
  dVar9 = dVar6 + dVar8;
  if (dVar9 < pQVar1->dragStartDistance || dVar9 == pQVar1->dragStartDistance) {
    bVar3 = false;
    goto LAB_005dc9d9;
  }
  if (dVar8 <= dVar6) {
    if (pQVar1->hOvershootPolicy != OvershootAlwaysOn) {
      dVar6 = (this->contentPosRange).w;
      goto LAB_005dc923;
    }
  }
  else if (pQVar1->vOvershootPolicy != OvershootAlwaysOn) {
    dVar6 = (this->contentPosRange).h;
LAB_005dc923:
    if (dVar6 <= 0.0) {
      bVar3 = false;
      setState(this,Inactive);
      goto LAB_005dc9d9;
    }
  }
  setState(this,Dragging);
  uVar4 = -(ulong)(dVar10 < -dVar10);
  uVar5 = -(ulong)(dVar11 < -dVar11);
  dVar6 = pQVar1->dragStartDistance /
          ((double)(~uVar5 & (ulong)dVar11 | (ulong)-dVar11 & uVar5) +
          (double)(~uVar4 & (ulong)dVar10 | (ulong)-dVar10 & uVar4));
  local_48.xp = dVar10 - dVar6 * dVar10;
  local_48.yp = dVar11 - dVar6 * dVar11;
  local_58.xp = 0.0;
  local_58.yp = 0.0;
  bVar2 = ::operator!=(&local_48,&local_58);
  bVar3 = true;
  if (bVar2) {
    local_58.xp = (this->pressPosition).xp + local_48.xp;
    local_58.yp = (this->pressPosition).yp + local_48.yp;
    handleDrag(this,&local_58,timestamp);
  }
LAB_005dc9d9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QScrollerPrivate::moveWhilePressed(const QPointF &position, qint64 timestamp)
{
    Q_Q(QScroller);
    const QScrollerPropertiesPrivate *sp = properties.d.data();
    QPointF ppm = q->pixelPerMeter();

    QPointF deltaPixel = position - pressPosition;

    bool moveAborted = false;
    bool moveStarted = (((deltaPixel / ppm).manhattanLength()) > sp->dragStartDistance);

    // check the direction of the mouse drag and abort if it's too much in the wrong direction.
    if (moveStarted) {
        QRectF max = contentPosRange;
        bool canScrollX = (max.width() > 0);
        bool canScrollY = (max.height() > 0);

        if (sp->hOvershootPolicy == QScrollerProperties::OvershootAlwaysOn)
            canScrollX = true;
        if (sp->vOvershootPolicy == QScrollerProperties::OvershootAlwaysOn)
            canScrollY = true;

        if (qAbs(deltaPixel.x() / ppm.x()) < qAbs(deltaPixel.y() / ppm.y())) {
            if (!canScrollY)
                moveAborted = true;
        } else {
            if (!canScrollX)
                moveAborted = true;
        }
    }

    if (moveAborted) {
        setState(QScroller::Inactive);
        moveStarted = false;

    } else if (moveStarted) {
        setState(QScroller::Dragging);

        // subtract the dragStartDistance
        deltaPixel = deltaPixel - deltaPixel * (sp->dragStartDistance / deltaPixel.manhattanLength());

        if (deltaPixel != QPointF(0, 0)) {
            // handleDrag updates lastPosition, lastTimestamp and velocity
            handleDrag(pressPosition + deltaPixel, timestamp);
        }
    }
    return moveStarted;
}